

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFortranModuleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *working_dir)

{
  string local_40;
  string *local_20;
  string *working_dir_local;
  cmGeneratorTarget *this_local;
  
  local_20 = working_dir;
  working_dir_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  if ((this->FortranModuleDirectoryCreated & 1U) == 0) {
    CreateFortranModuleDirectory(&local_40,this,working_dir);
    std::__cxx11::string::operator=((string *)&this->FortranModuleDirectory,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this->FortranModuleDirectoryCreated = true;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->FortranModuleDirectory);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFortranModuleDirectory(
  std::string const& working_dir) const
{
  if (!this->FortranModuleDirectoryCreated) {
    this->FortranModuleDirectory =
      this->CreateFortranModuleDirectory(working_dir);
    this->FortranModuleDirectoryCreated = true;
  }

  return this->FortranModuleDirectory;
}